

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
             *this,char **it)

{
  size_t sVar1;
  ptrdiff_t _Num;
  char *__dest;
  char *pcVar2;
  
  sVar1 = *(size_t *)(this + 0x10);
  __dest = *it;
  if (sVar1 != 0) {
    memmove(__dest,*(void **)(this + 8),sVar1);
    __dest = __dest + sVar1;
    *it = __dest;
  }
  sVar1 = *(size_t *)(this + 0x20);
  pcVar2 = __dest;
  if (sVar1 != 0) {
    pcVar2 = __dest + sVar1;
    memset(__dest,*(int *)(this + 0x18),sVar1);
  }
  *it = pcVar2;
  int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }